

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O2

void Js::CacheOperators::CachePropertyWrite
               (RecyclableObject *object,bool isRoot,Type *typeWithoutProperty,PropertyId propertyId
               ,PropertyValueInfo *info,ScriptContext *requestContext)

{
  InlineCacheFlags IVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  RecyclableObject *obj;
  long lVar6;
  Type *pTVar7;
  DynamicTypeHandler *oldTypeHandler;
  DynamicTypeHandler *newTypeHandler;
  code *pcVar8;
  bool bVar9;
  ushort uVar10;
  PropertyIndex PVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined4 *puVar15;
  RootObjectBase *this;
  DynamicObject *pDVar16;
  ushort uVar17;
  
  if (typeWithoutProperty == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xa5,"(typeWithoutProperty != nullptr)",
                                "typeWithoutProperty != nullptr");
    if (!bVar9) goto LAB_008816f8;
    *puVar15 = 0;
  }
  bVar9 = CanCachePropertyWrite(info,object,requestContext);
  if (!bVar9) {
    return;
  }
  IVar1 = info->flags;
  if (info->m_instance != object && IVar1 != InlineCacheSetterFlag) {
    if ((info->m_instance != (RecyclableObject *)0x0) && (info->m_propertyIndex == 0xffff)) {
      return;
    }
    iVar12 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[9])(object,(ulong)(uint)propertyId);
    if ((short)iVar12 == -1) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xb2,
                                "(info->IsNoCache() || object->GetPropertyIndex(propertyId) == Constants::NoSlot)"
                                ,"Missed updating PropertyValueInfo?");
    if (bVar9) {
      *puVar15 = 0;
      return;
    }
    goto LAB_008816f8;
  }
  uVar2 = info->m_propertyIndex;
  if (IVar1 == InlineCacheSetterFlag) {
    if (0xfff < uVar2) {
      return;
    }
    if (!isRoot) {
LAB_00880f6e:
      iVar12 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[9])(object,(ulong)(uint)propertyId);
      uVar10 = (ushort)iVar12;
      if (IVar1 != InlineCacheSetterFlag) goto LAB_00880f80;
    }
  }
  else {
    if (uVar2 == 0xffff) {
      return;
    }
    if (!isRoot) goto LAB_00880f6e;
    this = VarTo<Js::RootObjectBase,Js::RecyclableObject>(object);
    uVar10 = RootObjectBase::GetRootPropertyIndex(this,propertyId);
LAB_00880f80:
    if (uVar2 != uVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,200,
                                  "((!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter || (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId)))"
                                  ,
                                  "(!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter || (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId))"
                                 );
      if (!bVar9) goto LAB_008816f8;
      *puVar15 = 0;
    }
  }
  bVar9 = DynamicType::Is(((object->type).ptr)->typeId);
  if (!bVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xc9,"(DynamicType::Is(object->GetTypeId()))",
                                "DynamicType::Is(object->GetTypeId())");
    if (!bVar9) goto LAB_008816f8;
    *puVar15 = 0;
  }
  if ((info->flags & InlineCacheGetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xca,"((info->GetFlags() & InlineCacheGetterFlag) == 0)",
                                "invalid getter for CachePropertyWrite");
    if (!bVar9) goto LAB_008816f8;
    *puVar15 = 0;
  }
  obj = info->m_instance;
  pDVar16 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
  lVar6 = *(long *)((pDVar16->super_RecyclableObject).type.ptr + 1);
  uVar10 = *(ushort *)(lVar6 + 0x12);
  uVar17 = -uVar10;
  if (uVar2 < uVar10) {
    uVar17 = *(ushort *)(lVar6 + 10) >> 3;
  }
  uVar17 = uVar17 + uVar2;
  if (IVar1 == InlineCacheSetterFlag) {
    if ((obj == object) ||
       ((((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
        ptr == requestContext)) {
      Cache<true,false,false>
                (obj != object,pDVar16,false,(object->type).ptr,(Type *)0x0,propertyId,uVar17,
                 uVar2 < uVar10,false,0,info,requestContext);
    }
  }
  else {
    if (obj != object) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd4,"(instance == object)","invalid instance for non setter");
      if (!bVar9) goto LAB_008816f8;
      *puVar15 = 0;
    }
    bVar9 = DynamicType::Is(typeWithoutProperty);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd5,"(DynamicType::Is(typeWithoutProperty))",
                                  "DynamicType::Is(typeWithoutProperty)");
      if (!bVar9) goto LAB_008816f8;
      *puVar15 = 0;
    }
    if ((((info->m_instance == (RecyclableObject *)0x0) || (info->m_propertyIndex != 0xffff)) &&
        ((info->cacheInfoFlag & enableStoreFieldCacheFlag) != 0)) &&
       (iVar12 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x48])(object,(ulong)(uint)propertyId,(ulong)isRoot)
       , (char)iVar12 == '\0')) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd7,
                                  "(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot))"
                                  ,
                                  "info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot)"
                                 );
      if (!bVar9) goto LAB_008816f8;
      *puVar15 = 0;
    }
    if ((info->m_attributes & 4) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd9,"(info->IsWritable())","info->IsWritable()");
      if (!bVar9) goto LAB_008816f8;
      *puVar15 = 0;
    }
    pTVar7 = (object->type).ptr;
    if (pTVar7 == (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xde,"(newType)","newType");
      if (!bVar9) goto LAB_008816f8;
      *puVar15 = 0;
    }
    if (((pTVar7 == typeWithoutProperty) ||
        (*(char *)((long)&pTVar7[1].javascriptLibrary.ptr + 1) != '\x01')) ||
       ((iVar12 = (**(code **)(**(long **)(pTVar7 + 1) + 0x270))(), iVar12 == 0 ||
        (oldTypeHandler = *(DynamicTypeHandler **)(typeWithoutProperty + 1),
        (oldTypeHandler->flags & 0x20) != 0)))) {
      typeWithoutProperty = (Type *)0x0;
      iVar12 = 0;
    }
    else {
      newTypeHandler = *(DynamicTypeHandler **)(pTVar7 + 1);
      iVar12 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x4e])(oldTypeHandler);
      if (iVar12 == 0) {
        return;
      }
      iVar4 = oldTypeHandler->slotCapacity;
      iVar5 = newTypeHandler->slotCapacity;
      uVar13 = (uint)newTypeHandler->inlineSlotCapacity;
      iVar12 = (*oldTypeHandler->_vptr_DynamicTypeHandler[6])(oldTypeHandler);
      iVar14 = (*newTypeHandler->_vptr_DynamicTypeHandler[6])(newTypeHandler);
      if (iVar12 + 1 != iVar14) {
        iVar12 = (*oldTypeHandler->_vptr_DynamicTypeHandler[6])();
        iVar14 = (*newTypeHandler->_vptr_DynamicTypeHandler[6])(newTypeHandler);
        if (iVar12 != iVar14) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar15 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0xf7,
                                      "(((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() + 1 == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount() || ((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount())"
                                      ,"Don\'t cache type transitions that add multiple properties."
                                     );
          if (!bVar9) goto LAB_008816f8;
          *puVar15 = 0;
        }
      }
      bVar9 = DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining
                        (oldTypeHandler,newTypeHandler);
      if (!bVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar15 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                    ,0xfb,
                                    "(DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(oldTypeHandler, newTypeHandler))"
                                    ,"TypeHandler should be compatible for transition.");
        if (!bVar9) goto LAB_008816f8;
        *puVar15 = 0;
      }
      if (((uVar2 < uVar10) && (iVar4 != iVar5)) && ((int)uVar13 < iVar5)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar15 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                    ,0xfe,
                                    "(!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity)"
                                    ,
                                    "!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity"
                                   );
        if (!bVar9) goto LAB_008816f8;
        *puVar15 = 0;
      }
      if ((uVar10 <= uVar2) && (iVar5 <= (int)uVar13)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar15 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                    ,0x100,"(isInlineSlot || newCapacity > newInlineCapacity)",
                                    "isInlineSlot || newCapacity > newInlineCapacity");
        if (!bVar9) goto LAB_008816f8;
        *puVar15 = 0;
      }
      if ((((uVar10 <= uVar2) && (iVar4 != iVar5)) &&
          (iVar4 - (uint)oldTypeHandler->inlineSlotCapacity != (uint)uVar17)) &&
         (((bVar9 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(oldTypeHandler), !bVar9 ||
           (uVar3 = oldTypeHandler->inlineSlotCapacity,
           PVar11 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity(),
           (uint)uVar3 - (uint)PVar11 != uVar13)) ||
          (PVar11 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity(), uVar17 != PVar11))))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar15 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                    ,0x10f,
                                    "(isInlineSlot || oldCapacity == newCapacity || slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() || ( oldTypeHandler->IsObjectHeaderInlinedTypeHandler() && newInlineCapacity == oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() && slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() ))"
                                    ,
                                    "isInlineSlot || oldCapacity == newCapacity || slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() || ( oldTypeHandler->IsObjectHeaderInlinedTypeHandler() && newInlineCapacity == oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() && slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() )"
                                   );
        if (!bVar9) goto LAB_008816f8;
        *puVar15 = 0;
      }
      iVar12 = iVar5 - uVar13;
      if (iVar5 <= iVar4) {
        iVar12 = 0;
      }
      if (uVar2 < uVar10) {
        iVar12 = 0;
      }
      if (0x7fff < iVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar15 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                    ,0x114,
                                    "(requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount))"
                                    ,
                                    "requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount)"
                                   );
        if (!bVar9) {
LAB_008816f8:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        *puVar15 = 0;
        iVar12 = iVar5 - uVar13;
      }
    }
    pDVar16 = VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    Cache<false,false,true>
              (false,pDVar16,isRoot,(object->type).ptr,typeWithoutProperty,propertyId,uVar17,
               uVar2 < uVar10,false,iVar12,info,requestContext);
  }
  return;
}

Assistant:

void CacheOperators::CachePropertyWrite(
        RecyclableObject * object,
        const bool isRoot,
        Type* typeWithoutProperty,
        PropertyId propertyId,
        PropertyValueInfo* info,
        ScriptContext * requestContext)
    {
        Assert(typeWithoutProperty != nullptr);

        if (!CacheOperators::CanCachePropertyWrite(info, object, requestContext))
        {
            return;
        }

        BOOL isSetter = (info->GetFlags() == InlineCacheSetterFlag);

        if (info->GetInstance() != object) // We can't cache if slot owner is not the object
        {
            if (!isSetter)
            {
                AssertMsg(info->IsNoCache() || object->GetPropertyIndex(propertyId) == Constants::NoSlot, "Missed updating PropertyValueInfo?");
                return;
            }
        }

        PropertyIndex propertyIndex = info->GetPropertyIndex();
        if (isSetter)
        {
            if (propertyIndex & 0xf000)
            {
                return;
            }
        }
        else
        {
            if (propertyIndex == Constants::NoSlot)
            {
                return;
            }
        }

        Assert((!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter ||
            (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId)));
        Assert(DynamicType::Is(object->GetTypeId()));
        AssertMsg((info->GetFlags() & InlineCacheGetterFlag) == 0, "invalid getter for CachePropertyWrite");

        RecyclableObject* instance = info->GetInstance();
        DynamicObject * dynamicInstance = VarTo<DynamicObject>(instance);
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicInstance->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(propertyIndex, &slotIndex, &isInlineSlot);

        if (!isSetter)
        {
            AssertMsg(instance == object, "invalid instance for non setter");
            Assert(DynamicType::Is(typeWithoutProperty));
#if ENABLE_FIXED_FIELDS
            Assert(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot));
#endif
            Assert(info->IsWritable());

            DynamicType* newType = (DynamicType*)object->GetType();
            DynamicType* oldType = (DynamicType*)typeWithoutProperty;

            Assert(newType);

            int requiredAuxSlotCapacity;
            // Don't cache property adds for types that aren't (yet) shared.  We must go down the slow path to force type sharing
            // and invalidate any potential fixed fields this type may have.
            // Don't cache property adds to prototypes, so we don't have to check if the object is a prototype on the fast path.
            if (newType != oldType && newType->GetIsShared() && newType->GetTypeHandler()->IsPathTypeHandler() && (!oldType->GetTypeHandler()->GetIsPrototype()))
            {
                DynamicTypeHandler* oldTypeHandler = oldType->GetTypeHandler();
                DynamicTypeHandler* newTypeHandler = newType->GetTypeHandler();

                // This may be the transition from deferred type handler to path type handler. Don't try to cache now.
                if (!oldTypeHandler->IsPathTypeHandler())
                {
                    return;
                }

                int oldCapacity = oldTypeHandler->GetSlotCapacity();
                int newCapacity = newTypeHandler->GetSlotCapacity();
                int newInlineCapacity = newTypeHandler->GetInlineSlotCapacity();

                // We are adding only one property here.  If some other properties were added as a side effect on the slow path
                // we should never cache the type transition, as the other property slots will not be populated by the fast path.
                AssertMsg(((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() + 1 == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount() ||
                          ((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount(),
                    "Don't cache type transitions that add multiple properties.");

                // InlineCache::TrySetProperty assumes the following invariants to decide if and how to adjust auxiliary slot capacity.
                AssertMsg(DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(oldTypeHandler, newTypeHandler),
                    "TypeHandler should be compatible for transition.");

                // If the slot is inlined then we should never need to adjust auxiliary slot capacity.
                Assert(!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity);
                // If the slot is not inlined then the new type must have some auxiliary slots.
                Assert(isInlineSlot || newCapacity > newInlineCapacity);

                // If the slot is not inlined and the property being added exceeds the old type's slot capacity, then slotIndex corresponds
                // to the number of occupied auxiliary slots (i.e. the old type's auxiliary slot capacity).
                // If the object is optimized for <=2 properties, then slotIndex should be same as the oldCapacity(as there is no inlineSlots in the new typeHandler).
                Assert(
                    isInlineSlot ||
                    oldCapacity == newCapacity ||
                    slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() ||
                    (
                        oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
                        newInlineCapacity ==
                            oldTypeHandler->GetInlineSlotCapacity() -
                            DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() &&
                        slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
                    ));

                requiredAuxSlotCapacity = (!isInlineSlot && oldCapacity < newCapacity) ? newCapacity - newInlineCapacity : 0;

                // Required auxiliary slot capacity must fit in the available inline cache bits.
                Assert(requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount));
            }
            else
            {
                typeWithoutProperty = nullptr;
                requiredAuxSlotCapacity = 0;
            }

            Cache<false, false, true>(
                false,
                VarTo<DynamicObject>(object),
                isRoot,
                object->GetType(),
                typeWithoutProperty,
                propertyId,
                slotIndex,
                isInlineSlot,
                false,
                requiredAuxSlotCapacity,
                info,
                requestContext);
            return;
        }

        const bool isProto = instance != object;
        if(isProto && instance->GetScriptContext() != requestContext)
        {
            // Don't cache if object and prototype are from different context
            return;
        }

        Cache<true, false, false>(
            isProto,
            dynamicInstance,
            false,
            object->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            false,
            0,
            info,
            requestContext);
    }